

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

ServerSegment * __thiscall ServerService::startControlService(ServerService *this)

{
  int __fd;
  ostream *this_00;
  ServerSegment *segment;
  byte buffer [1472];
  undefined1 local_a0 [8];
  sockaddr_storage clientDetails;
  socklen_t clientLength;
  ServerService *this_local;
  
  memset(&segment,0,0x5c0);
  clientDetails.__ss_align._4_4_ = 0x80;
  __fd = ServerSocketUDP::getSocket(this->serverSocketUDP);
  recvfrom(__fd,&segment,0x5c0,0,(sockaddr *)local_a0,
           (socklen_t *)((long)&clientDetails.__ss_align + 4));
  this_local = (ServerService *)parseRequest(this,(byte *)&segment);
  if ((((ServerSegment *)this_local)->data == (byte *)0x0) ||
     (((ServerSegment *)this_local)->ackFlag != 'N')) {
    this_local = (ServerService *)0x0;
  }
  else {
    std::operator<<((ostream *)&std::cout,"received: ");
    this_00 = std::operator<<((ostream *)&std::cout,(char *)((ServerSegment *)this_local)->data);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return (ServerSegment *)this_local;
}

Assistant:

ServerSegment* ServerService::startControlService() {
    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    clientLength = sizeof(clientDetails);
    recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
    ServerSegment *segment = parseRequest(buffer);

    if (segment->data && segment->ackFlag == 'N') {
        cout << "received: ";
        cout << (char *) segment->data << endl;
        return segment;
    } else {
        return nullptr;
    }
}